

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O2

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::cleanTexture
          (ReadnPixelsTest *this,GLuint texture_id)

{
  GLuint i;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  GLubyte pixels [64];
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    pixels[lVar2] = '@';
  }
  RobustnessRobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
  RobustnessRobustBufferAccessBehavior::Texture::SubImage
            (gl,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,pixels);
  RobustnessRobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
  return;
}

Assistant:

void ReadnPixelsTest::cleanTexture(glw::GLuint texture_id)
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLubyte pixels[width * height];
	for (GLuint i = 0; i < width * height; ++i)
	{
		pixels[i] = 64;
	}

	Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level  */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, pixels);

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);
}